

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,-1,false>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,false>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,
               Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
               *lhs,Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false> *rhs,
               Scalar *alpha)

{
  double dVar1;
  long lVar2;
  variable_if_dynamic<long,__1> *pvVar3;
  ReturnType RVar4;
  RhsNested actual_rhs;
  LhsNested actual_lhs;
  
  if ((lhs->
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      ).
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
      .m_rows.m_value == 1) {
    dVar1 = *alpha;
    Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_1,_-1,_false>
    ::Block((Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1,__1,_false>
             *)&actual_lhs,lhs,0);
    BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_-1,_1,_true,_true>
    ::BlockImpl_dense((BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,__1,_1,_true,_true>
                       *)&actual_rhs,rhs,0);
    RVar4 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,-1,false>const,1,-1,false>>
            ::
            dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const,_1,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>const,1,_1,false>>
                        *)&actual_lhs,
                       (MatrixBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,__1,_1,_true>_>
                        *)&actual_rhs);
    **(double **)dst = RVar4 * dVar1 + **(double **)dst;
  }
  else {
    pvVar3 = (variable_if_dynamic<long,__1> *)&actual_lhs;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      pvVar3->m_value = ((variable_if_dynamic<long,__1> *)lhs)->m_value;
      lhs = (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
             *)((long)lhs + 8);
      pvVar3 = pvVar3 + 1;
    }
    actual_rhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    m_outerStride =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
         ).super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
         .m_outerStride;
    actual_rhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
    m_data = (rhs->
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
             ).
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
             .m_data;
    actual_rhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
    m_rows.m_value =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
         ).super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
         .m_rows.m_value;
    actual_rhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
    _16_8_ = *(undefined8 *)
              &(rhs->
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
               .field_0x10;
    actual_rhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.m_xpr
         = (rhs->
           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
           .m_xpr;
    actual_rhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    m_startRow.m_value =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
         ).super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
         .m_startRow.m_value;
    actual_rhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    m_startCol.m_value =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
         ).super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
         .m_startCol.m_value;
    gemv_dense_selector<2,0,true>::
    run<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
                *)&actual_lhs,&actual_rhs,dst,alpha);
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }